

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O0

int4 __thiscall
PcodeInjectLibrarySleigh::manualCallOtherFixup
          (PcodeInjectLibrarySleigh *this,string *name,string *outname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inname,string *snippet)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  vector<InjectParameter,_std::allocator<InjectParameter>_> *pvVar4;
  const_reference nm;
  long lVar5;
  InjectParameter local_e0;
  InjectParameter local_b8;
  int local_8c;
  InjectPayload *pIStack_88;
  int4 i;
  InjectPayloadSleigh *payload;
  int4 injectid;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string sourceName;
  string *snippet_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inname_local;
  string *outname_local;
  string *name_local;
  PcodeInjectLibrarySleigh *this_local;
  
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "<manual callotherfixup name=\"");
  std::operator+(local_50,(char *)local_70);
  std::__cxx11::string::~string(local_70);
  payload._0_4_ =
       (**(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary)(this,local_50,name,2);
  pIStack_88 = PcodeInjectLibrary::getPayload(&this->super_PcodeInjectLibrary,(uint)payload);
  local_8c = 0;
  while( true ) {
    uVar2 = (ulong)local_8c;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(inname);
    if (sVar3 <= uVar2) break;
    pvVar4 = &pIStack_88->inputlist;
    nm = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](inname,(long)local_8c);
    InjectParameter::InjectParameter(&local_b8,nm,0);
    std::vector<InjectParameter,_std::allocator<InjectParameter>_>::push_back(pvVar4,&local_b8);
    InjectParameter::~InjectParameter(&local_b8);
    local_8c = local_8c + 1;
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    pvVar4 = &pIStack_88->output;
    InjectParameter::InjectParameter(&local_e0,outname,0);
    std::vector<InjectParameter,_std::allocator<InjectParameter>_>::push_back(pvVar4,&local_e0);
    InjectParameter::~InjectParameter(&local_e0);
  }
  InjectPayload::orderParameters(pIStack_88);
  std::__cxx11::string::operator=((string *)&pIStack_88[1].name,(string *)snippet);
  (*(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary[1])(this,(ulong)(uint)payload);
  uVar1 = (uint)payload;
  std::__cxx11::string::~string((string *)local_50);
  return uVar1;
}

Assistant:

int4 PcodeInjectLibrarySleigh::manualCallOtherFixup(const string &name,const string &outname,
						    const vector<string> &inname,const string &snippet)
{
  string sourceName = "<manual callotherfixup name=\"" + name + "\")";
  int4 injectid = allocateInject(sourceName, name, InjectPayload::CALLOTHERFIXUP_TYPE);
  InjectPayloadSleigh *payload = (InjectPayloadSleigh *)getPayload(injectid);
  for(int4 i=0;i<inname.size();++i)
    payload->inputlist.push_back(InjectParameter(inname[i],0));
  if (outname.size() != 0)
    payload->output.push_back(InjectParameter(outname,0));
  payload->orderParameters();
  payload->parsestring = snippet;
  registerInject(injectid);
  return injectid;
}